

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_definitions.hpp
# Opt level: O0

double units::detail::convertTemperature<units::precise_unit,units::precise_unit>
                 (double val,precise_unit *start,precise_unit *result)

{
  precise_unit *ppVar1;
  bool bVar2;
  const_reference pvVar3;
  double dVar4;
  double dVar5;
  unit local_38;
  unit local_30;
  precise_unit *local_28;
  precise_unit *result_local;
  precise_unit *start_local;
  double val_local;
  
  local_28 = result;
  result_local = start;
  start_local = (precise_unit *)val;
  bVar2 = is_temperature(start);
  ppVar1 = start_local;
  if (bVar2) {
    local_30 = unit_cast(result_local);
    bVar2 = unit::operator==((unit *)&degF,&local_30);
    if (bVar2) {
      start_local = (precise_unit *)((((double)start_local - 32.0) * 5.0) / 9.0);
    }
    else {
      dVar4 = precise_unit::multiplier(result_local);
      if ((dVar4 != 1.0) || (NAN(dVar4))) {
        dVar4 = precise_unit::multiplier(result_local);
        if ((29.5 <= dVar4) ||
           (dVar4 = precise_unit::multiplier(result_local), ppVar1 = start_local, dVar4 < 0.0)) {
          ppVar1 = start_local;
          dVar4 = precise_unit::multiplier(result_local);
          start_local = (precise_unit *)((double)ppVar1 * dVar4);
        }
        else {
          dVar4 = precise_unit::multiplier(result_local);
          dVar5 = precise_unit::multiplier(result_local);
          pvVar3 = std::array<double,_30UL>::operator[]
                             (&convertTemperature<units::precise_unit,_units::precise_unit>::
                               biasTable,(long)(int)dVar5);
          start_local = (precise_unit *)((double)ppVar1 * dVar4 + *pvVar3);
        }
      }
    }
    start_local = (precise_unit *)((double)start_local + 273.15);
  }
  else {
    dVar4 = precise_unit::multiplier(result_local);
    start_local = (precise_unit *)((double)ppVar1 * dVar4);
  }
  bVar2 = is_temperature(local_28);
  ppVar1 = start_local;
  if (bVar2) {
    start_local = (precise_unit *)((double)start_local - 273.15);
    local_38 = unit_cast(local_28);
    bVar2 = unit::operator==((unit *)&degF,&local_38);
    if (bVar2) {
      start_local = (precise_unit *)((double)start_local * 1.8 + 32.0);
    }
    else {
      dVar4 = precise_unit::multiplier(local_28);
      if ((dVar4 != 1.0) || (NAN(dVar4))) {
        dVar4 = precise_unit::multiplier(local_28);
        if ((29.5 <= dVar4) ||
           (dVar4 = precise_unit::multiplier(local_28), ppVar1 = start_local, dVar4 < 0.0)) {
          ppVar1 = start_local;
          dVar4 = precise_unit::multiplier(local_28);
          start_local = (precise_unit *)((double)ppVar1 / dVar4);
        }
        else {
          dVar4 = precise_unit::multiplier(local_28);
          pvVar3 = std::array<double,_30UL>::operator[]
                             (&convertTemperature<units::precise_unit,_units::precise_unit>::
                               biasTable,(long)(int)dVar4);
          dVar4 = *pvVar3;
          dVar5 = precise_unit::multiplier(local_28);
          start_local = (precise_unit *)(((double)ppVar1 - dVar4) / dVar5);
        }
      }
    }
    val_local = (double)start_local;
  }
  else {
    dVar4 = precise_unit::multiplier(local_28);
    val_local = (double)ppVar1 / dVar4;
  }
  return val_local;
}

Assistant:

double convertTemperature(double val, const UX& start, const UX2& result)
    {
        static constexpr std::array<double, 30> biasTable{
            0.0, 0.0, 0.0, 0.0, 0.0,   0.0,   0.0, 0.0,     0.0, 0.0,
            0.0, 0.0, 0.0, 0.0, 121.0, 0.0,   0.0, 0.0,     0.0, 0.0,
            0.0, 0.0, 0.0, 0.0, 0.0,   150.0, 0.0, 37.7778, 0.0, 0.0};

        if (is_temperature(start)) {
            if (units::degF == unit_cast(start)) {
                val = (val - 32.0) * 5.0 / 9.0;
            } else if (start.multiplier() != 1.0) {
                if (start.multiplier() < 29.5 && start.multiplier() >= 0.0) {
                    val = val * start.multiplier() +
                        biasTable[static_cast<int>(start.multiplier())];
                } else {
                    val = val * start.multiplier();
                }
            }
            val += 273.15;
            // convert to K
        } else {
            val = val * start.multiplier();
        }
        if (is_temperature(result)) {
            val -= 273.15;
            if (units::degF == unit_cast(result)) {
                val *= 9.0 / 5.0;
                val += 32.0;
            } else if (result.multiplier() != 1.0) {
                if (result.multiplier() < 29.5 && result.multiplier() >= 0.0) {
                    val = (val -
                           biasTable[static_cast<int>(result.multiplier())]) /
                        result.multiplier();
                } else {
                    val = val / result.multiplier();
                }
            }
            return val;
        }
        return val / result.multiplier();
    }